

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void av1_lowbd_inv_txfm2d_add_v_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  byte in_CL;
  byte in_R8B;
  int in_R9D;
  int j_2;
  int j_1;
  __m128i temp [8];
  int j;
  __m128i *_buf1;
  __m128i buf0 [64];
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_ssse3 row_txfm;
  int fun_idx;
  int rect_type;
  int input_stride;
  int buf_size_h_div8;
  int buf_size_nonzero_w;
  int buf_size_w_div8;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  int eoby;
  int eobx;
  __m128i buf1 [64];
  int out_size;
  int in_stack_fffffffffffff6f0;
  int in_stack_fffffffffffff6f4;
  int in_stack_fffffffffffff6fc;
  int32_t *in_stack_fffffffffffff700;
  int in_stack_fffffffffffff73c;
  int in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  __m128i *in_stack_fffffffffffff748;
  int in_stack_fffffffffffff754;
  uint8_t *in_stack_fffffffffffff758;
  __m128i *in_stack_fffffffffffff760;
  __m128i *in_stack_fffffffffffff768;
  int local_884;
  longlong local_878 [128];
  int local_474;
  int local_470;
  int local_46c;
  transform_1d_ssse3 local_468;
  int local_460;
  int local_45c;
  int local_458;
  int local_454;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  int local_440;
  int local_43c;
  char *local_438;
  int local_430;
  int local_42c [261];
  byte local_16;
  byte local_15;
  
  local_16 = in_R8B;
  local_15 = in_CL;
  get_eobx_eoby_scan_v_identity(local_42c,&local_430,in_R8B,in_R9D);
  local_438 = av1_inv_txfm_shift_ls[local_16];
  local_43c = get_txw_idx(local_16);
  local_440 = get_txh_idx(local_16);
  local_444 = tx_size_wide[local_16];
  local_448 = tx_size_high[local_16];
  local_44c = local_444 >> 3;
  local_450 = (local_42c[0] + 8 >> 3) << 3;
  local_454 = local_430 + 8 >> 3;
  out_size = local_448;
  if (0x20 < local_448) {
    out_size = 0x20;
  }
  local_458 = out_size;
  local_45c = get_rect_tx_log_ratio(local_444,local_448);
  local_460 = lowbd_txfm_all_1d_zeros_idx[local_42c[0]];
  local_468 = lowbd_txfm_all_1d_zeros_w8_arr[local_43c][""[local_15]][local_460];
  get_flip_cfg(local_15,&local_46c,&local_470);
  for (local_474 = 0; local_474 < local_454; local_474 = local_474 + 1) {
    load_buffer_32bit_to_16bit
              (in_stack_fffffffffffff700,in_stack_fffffffffffff6fc,
               (__m128i *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),out_size);
    if ((local_45c == 1) || (local_45c == -1)) {
      round_shift_ssse3((__m128i *)local_878,(__m128i *)local_878,local_450);
    }
    (*local_468)((__m128i *)local_878,(__m128i *)local_878);
    round_shift_16bit_ssse3((__m128i *)local_878,local_444,(int)*local_438);
    if (local_470 == 0) {
      for (in_stack_fffffffffffff6f4 = 0; in_stack_fffffffffffff6f4 < local_44c;
          in_stack_fffffffffffff6f4 = in_stack_fffffffffffff6f4 + 1) {
        transpose_16bit_8x8(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      }
    }
    else {
      for (local_884 = 0; local_884 < local_44c; local_884 = local_884 + 1) {
        flip_buf_sse2((__m128i *)(local_878 + (long)(local_884 << 3) * 2),
                      (__m128i *)&stack0xfffffffffffff6f8,8);
        transpose_16bit_8x8(in_stack_fffffffffffff768,in_stack_fffffffffffff760);
      }
    }
    for (in_stack_fffffffffffff6f0 = 0; in_stack_fffffffffffff6f0 < local_44c;
        in_stack_fffffffffffff6f0 = in_stack_fffffffffffff6f0 + 1) {
      iidentity_col_8xn_ssse3
                (in_stack_fffffffffffff758,in_stack_fffffffffffff754,in_stack_fffffffffffff748,
                 in_stack_fffffffffffff744,in_stack_fffffffffffff740,in_stack_fffffffffffff73c);
    }
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_v_identity_ssse3(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob) {
  __m128i buf1[64];
  int eobx, eoby;
  get_eobx_eoby_scan_v_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eobx];
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx];

  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_h_div8; i++) {
    __m128i buf0[64];
    load_buffer_32bit_to_16bit(input + i * 8, input_stride, buf0,
                               buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_ssse3(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_ssse3(buf0, txfm_size_col, shift[0]);
    __m128i *_buf1 = buf1;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        __m128i temp[8];
        flip_buf_sse2(buf0 + 8 * j, temp, 8);
        transpose_16bit_8x8(temp, _buf1 + 8 * (buf_size_w_div8 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_16bit_8x8(buf0 + 8 * j, _buf1 + 8 * j);
      }
    }

    for (int j = 0; j < buf_size_w_div8; ++j) {
      iidentity_col_8xn_ssse3(output + i * 8 * stride + j * 8, stride,
                              buf1 + j * 8, shift[1], 8, txh_idx);
    }
  }
}